

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O3

void __thiscall
Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
          (DenseStorage<double,__1,__1,__1,_0> *this,DenseIndex size,DenseIndex nbRows,
          DenseIndex nbCols)

{
  double *pdVar1;
  undefined8 *puVar2;
  
  if (this->m_cols * this->m_rows - size != 0) {
    free(this->m_data);
    if (size == 0) {
      pdVar1 = (double *)0x0;
    }
    else {
      if ((ulong)size >> 0x3d != 0) {
LAB_00112b37:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = operator_delete;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pdVar1 = (double *)malloc(size << 3);
      if (pdVar1 == (double *)0x0) goto LAB_00112b37;
    }
    this->m_data = pdVar1;
  }
  this->m_rows = nbRows;
  this->m_cols = nbCols;
  return;
}

Assistant:

void resize(DenseIndex size, DenseIndex nbRows, DenseIndex nbCols)
    {
      if(size != m_rows*m_cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, m_rows*m_cols);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN
      }
      m_rows = nbRows;
      m_cols = nbCols;
    }